

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O3

int dogfood(monst *mon,obj *obj)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  boolean bVar4;
  long lVar5;
  permonst *ppVar6;
  ushort uVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  byte bVar11;
  bool bVar12;
  
  uVar2 = mon->data->mflags1;
  uVar8 = obj->corpsenm;
  bVar4 = is_quest_artifact(obj);
  if ((bVar4 != '\0') || (bVar4 = obj_resists(obj,0,0x5f), bVar4 != '\0')) {
    return ((byte)obj->field_0x4a & 1) * 3 + 4;
  }
  if (obj->oclass == '\x0e') {
    return 6;
  }
  if (obj->oclass != '\a') {
    if (obj->otyp == 0xb4) {
      return 7;
    }
    if (obj->otyp == 0xcb) {
      return 7;
    }
    bVar4 = hates_silver(mon->data);
    if ((bVar4 != '\0') && ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xe0)) {
      return 7;
    }
    ppVar6 = mon->data;
    if ((ppVar6 == mons + 10) && ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) < 0x90)) {
      return 2;
    }
    if ((int)ppVar6->mflags1 < 0) {
      uVar7 = *(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f;
      if (((ushort)(uVar7 - 0xb) < 7) && (uVar7 == 0xb || ppVar6 != mons + 0xd9)) {
        if ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xb0) {
          return *(uint *)&obj->field_0x4a >> 0xb & 2;
        }
        return 2;
      }
    }
    if ((obj->field_0x4a & 1) != 0) {
      return 6;
    }
    if ((byte)(obj->oclass - 0xfU) < 2) {
      return 6;
    }
    return 4;
  }
  sVar1 = obj->otyp;
  if (sVar1 == 0x10e) {
    if (obj->corpsenm - 0xbU < 2) {
      if (uVar8 == 0x144 || (mon->mintrinsics & 0x80) == 0) {
        return 7;
      }
    }
    else if (uVar8 == 0x144) {
      return 7;
    }
    if (uVar8 - 0x145 < 2) {
      return 7;
    }
    ppVar6 = mon->data;
    if (ppVar6 == mons + 0xfd) {
      lVar5 = peek_at_iced_corpse_age(obj);
      if (lVar5 + 0x32 <= (long)(ulong)moves) {
        return 0;
      }
      return 7;
    }
  }
  else {
    ppVar6 = mon->data;
    if (ppVar6 == mons + 0xfd) {
      return 7;
    }
  }
  if ((ppVar6->mlet == '0') || ((ppVar6 == mons + 0x85 | (byte)(ppVar6->mflags2 >> 8) & 1) == 1)) {
    if (sVar1 != 0x10e) {
      return 7;
    }
    iVar3 = obj->corpsenm;
    bVar11 = mons[iVar3].mlet;
    if (bVar11 < 0x1f) {
      if (bVar11 < 0x16) {
        if (bVar11 == 2) {
          return 7;
        }
        if (bVar11 == 10) {
          return 7;
        }
      }
      else {
        if (bVar11 == 0x16) {
          return 7;
        }
        if (bVar11 == 0x19) {
          return 7;
        }
      }
    }
    else if (bVar11 < 0x2a) {
      if (bVar11 == 0x1f) {
        if (iVar3 != 0x9e) {
          return 7;
        }
      }
      else if (bVar11 == 0x20) {
        return 7;
      }
    }
    else if (bVar11 == 0x2a) {
      if (iVar3 != 0xd6) {
        return 7;
      }
    }
    else {
      if (bVar11 == 0x36) {
        return 7;
      }
      if ((bVar11 == 0x37) && (iVar3 != 0x106)) {
        return 7;
      }
    }
    if (((mons[iVar3].mflags2 & 2) != 0) && ((mons[iVar3].mflags2 >> 8 & 1) == 0 && bVar11 != 0x30))
    {
      return 7;
    }
    if (obj->oeaten != 0) {
      return 7;
    }
    lVar5 = peek_at_iced_corpse_age(obj);
    if ((long)(ulong)moves <= lVar5 + 5) {
      return 0;
    }
    return 7;
  }
  uVar10 = uVar2 >> 0x1d;
  bVar11 = (byte)(uVar2 >> 0x18);
  bVar9 = bVar11 >> 5;
  bVar11 = bVar11 >> 6;
  if (((bVar9 | bVar11) & 1) == 0) {
    return ((byte)obj->field_0x4a & 1) * 2 + 4;
  }
  if ((mon->mtame == '\0') || ((mon->field_0x63 & 4) != 0)) {
    bVar12 = false;
  }
  else {
    bVar12 = *(int *)&mon[1].minvent != 0;
  }
  switch(sVar1) {
  case 0x10d:
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
    uVar8 = (uint)((uVar10 & 1) == 0) * 3;
    break;
  case 0x10e:
    lVar5 = peek_at_iced_corpse_age(obj);
    iVar3 = obj->corpsenm;
    if ((((lVar5 + 0x32 <= (long)(ulong)moves) && (iVar3 != 0xa3)) && (iVar3 != 0x154)) &&
       (mon->data->mlet != ' ')) {
      return 5;
    }
    if (((mons[iVar3].mflags1 >> 0x1b & 1) != 0) && ((mon->mintrinsics & 0x40) == 0)) {
      return 5;
    }
    if (((mons[iVar3].mflags1 >> 0x1c & 1) != 0) && ((mon->mintrinsics & 0x20) == 0)) {
      return 5;
    }
    bVar11 = mons[(int)uVar8].mlet;
    if (((0x20 < (ulong)bVar11) || ((0x102400404U >> ((ulong)bVar11 & 0x3f) & 1) == 0)) &&
       (bVar11 != 0x1f || uVar8 == 0x9e)) {
      if ((bVar11 != 0x36) && (bVar11 != 0x37 || (uVar8 & 0xfffffffd) == 0x104)) goto LAB_001736a6;
    }
    uVar10 = uVar2 >> 0x1e;
    goto LAB_001736a6;
  case 0x10f:
    if ((obj->corpsenm - 0xbU < 2) && ((mon->mintrinsics & 0x80) == 0)) {
      return 5;
    }
LAB_001736a6:
    uVar8 = (uint)((uVar10 & 1) == 0) * 2 + 1;
    break;
  default:
    uVar8 = 2;
    if (!bVar12) {
      if (0x11e < sVar1) {
        bVar11 = bVar9;
      }
      uVar8 = bVar11 & 1 ^ 3;
    }
    break;
  case 0x116:
  case 0x11b:
    uVar10 = 0;
    uVar8 = !bVar12 + 2;
    bVar12 = (uVar2 >> 0x1e & 1) == 0;
    goto LAB_001736c9;
  case 0x11a:
    uVar10 = ((bVar11 & 1) != 0 || bVar12) ^ 3;
    uVar8 = 0;
    bVar12 = ppVar6->mlet == '3';
LAB_001736c9:
    if (!bVar12) {
      uVar8 = uVar10;
    }
    break;
  case 0x11d:
    uVar8 = 7;
    if ((ppVar6->mflags2 & 2) == 0) {
      uVar8 = ((bVar11 & 1) != 0 || bVar12) ^ 3;
    }
    break;
  case 0x129:
    uVar8 = ~ppVar6->mflags1 >> 0x1f | 2;
  }
  return uVar8;
}

Assistant:

int dogfood(struct monst *mon, struct obj *obj)
{
	boolean carni = carnivorous(mon->data);
	boolean herbi = herbivorous(mon->data);
	const struct permonst *fptr = &mons[obj->corpsenm];
	boolean starving;

	if (is_quest_artifact(obj) || obj_resists(obj, 0, 95))
	    return obj->cursed ? TABU : APPORT;

	switch(obj->oclass) {
	case FOOD_CLASS:
	    if (obj->otyp == CORPSE &&
		((touch_petrifies(&mons[obj->corpsenm]) && !resists_ston(mon))
		 || is_rider(fptr)))
		    return TABU;

	    /* Ghouls only eat old corpses... yum! */
	    if (mon->data == &mons[PM_GHOUL])
		return (obj->otyp == CORPSE &&
			peek_at_iced_corpse_age(obj) + 50L <= moves) ?
				DOGFOOD : TABU;

	    /* Vampires only "eat" very fresh corpses ... */
	    /* Assume meat -> blood */
	    if (is_vampiric(mon->data)) {
		return (obj->otyp == CORPSE &&
			has_blood(&mons[obj->corpsenm]) && !obj->oeaten &&
			peek_at_iced_corpse_age(obj) + 5 >= moves) ?
		       DOGFOOD : TABU;
	    }

	    if (!carni && !herbi)
		    return obj->cursed ? UNDEF : APPORT;

	    /* a starving pet will eat almost anything */
	    starving = (mon->mtame && !mon->isminion &&
			EDOG(mon)->mhpmax_penalty);

	    switch (obj->otyp) {
		case TRIPE_RATION:
		case MEATBALL:
		case MEAT_RING:
		case MEAT_STICK:
		case HUGE_CHUNK_OF_MEAT:
		    return carni ? DOGFOOD : MANFOOD;
		case EGG:
		    if (touch_petrifies(&mons[obj->corpsenm]) && !resists_ston(mon))
			return POISON;
		    return carni ? CADAVER : MANFOOD;
		case CORPSE:
		   if ((peek_at_iced_corpse_age(obj) + 50L <= moves
					    && obj->corpsenm != PM_LIZARD
					    && obj->corpsenm != PM_LICHEN
					    && mon->data->mlet != S_FUNGUS) ||
			(acidic(&mons[obj->corpsenm]) && !resists_acid(mon)) ||
			(poisonous(&mons[obj->corpsenm]) &&
						!resists_poison(mon)))
			return POISON;
		    else if (vegan(fptr))
			return herbi ? CADAVER : MANFOOD;
		    else return carni ? CADAVER : MANFOOD;
		case CLOVE_OF_GARLIC:
		    return (is_undead(mon->data) ? TABU :
			    ((herbi || starving) ? ACCFOOD : MANFOOD));
		case TIN:
		    return metallivorous(mon->data) ? ACCFOOD : MANFOOD;
		case APPLE:
		case CARROT:
		    return herbi ? DOGFOOD : starving ? ACCFOOD : MANFOOD;
		case BANANA:
		    return ((mon->data->mlet == S_YETI) ? DOGFOOD :
			    ((herbi || starving) ? ACCFOOD : MANFOOD));
		default:
		    if (starving) return ACCFOOD;
		    return (obj->otyp > SLIME_MOLD ?
			    (carni ? ACCFOOD : MANFOOD) :
			    (herbi ? ACCFOOD : MANFOOD));
	    }
	default:
	    if (obj->otyp == AMULET_OF_STRANGULATION ||
			obj->otyp == RIN_SLOW_DIGESTION)
		return TABU;
	    if (hates_silver(mon->data) &&
		objects[obj->otyp].oc_material == SILVER)
		return TABU;
	    if (mon->data == &mons[PM_GELATINOUS_CUBE] && is_organic(obj))
		return ACCFOOD;
	    if (metallivorous(mon->data) && is_metallic(obj) && (is_rustprone(obj) || mon->data != &mons[PM_RUST_MONSTER])) {
		/* Non-rustproofed ferrous based metals are preferred. */
		return (is_rustprone(obj) && !obj->oerodeproof) ? DOGFOOD : ACCFOOD;
	    }
	    if (!obj->cursed && obj->oclass != BALL_CLASS &&
						obj->oclass != CHAIN_CLASS)
		return APPORT;
	    /* fall into next case */
	case ROCK_CLASS:
	    return UNDEF;
	}
}